

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O1

int exefuse(voccxdef *ctx,int do_run)

{
  objnum oVar1;
  runcxdef *ctx_00;
  int iVar2;
  objnum thisa;
  vocddef *pvVar3;
  objnum thisf;
  uint uVar4;
  runsdef val;
  errdef fr_;
  
  ctx_00 = ctx->voccxrun;
  uVar4 = ctx->voccxfuc;
  if (uVar4 == 0) {
    iVar2 = 0;
  }
  else {
    pvVar3 = ctx->voccxfus;
    iVar2 = 0;
    do {
      oVar1 = pvVar3->vocdfn;
      if ((oVar1 != 0xffff) && (pvVar3->vocdtim == 0)) {
        fr_.errcode = _setjmp((__jmp_buf_tag *)fr_.errbuf);
        if (fr_.errcode == 0) {
          fr_.errprv = ctx->voccxerr->errcxptr;
          ctx->voccxerr->errcxptr = &fr_;
          vocdusav(ctx,pvVar3);
          pvVar3->vocdfn = 0xffff;
          if (do_run != 0) {
            val.runstyp = (pvVar3->vocdarg).runstyp;
            val._1_7_ = *(undefined7 *)&(pvVar3->vocdarg).field_0x1;
            val.runsv = (pvVar3->vocdarg).runsv;
            runpush(ctx_00,(uint)val.runstyp,&val);
            runfn(ctx_00,oVar1,1);
          }
          ctx->voccxerr->errcxptr = fr_.errprv;
        }
        else {
          ctx->voccxerr->errcxptr = fr_.errprv;
          if ((fr_.errcode != 0x3f5) && (fr_.errcode != 0x3fb)) goto LAB_001efab7;
        }
        iVar2 = 1;
      }
      pvVar3 = pvVar3 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  uVar4 = ctx->voccxalc;
  if (uVar4 != 0) {
    pvVar3 = ctx->voccxalm;
    do {
      oVar1 = pvVar3->vocdfn;
      if ((oVar1 != 0xffff) && (pvVar3->vocdtim == 0)) {
        fr_.errcode = _setjmp((__jmp_buf_tag *)fr_.errbuf);
        if (fr_.errcode == 0) {
          fr_.errprv = ctx->voccxerr->errcxptr;
          ctx->voccxerr->errcxptr = &fr_;
          vocdusav(ctx,pvVar3);
          pvVar3->vocdfn = 0xffff;
          if (do_run != 0) {
            runpprop(ctx_00,(uchar **)0x0,0,0,oVar1,pvVar3->vocdprp,0,0,oVar1);
          }
          ctx->voccxerr->errcxptr = fr_.errprv;
        }
        else {
          ctx->voccxerr->errcxptr = fr_.errprv;
          if ((fr_.errcode != 0x3f5) && (fr_.errcode != 0x3fb)) {
LAB_001efab7:
            errrse1(ctx->voccxerr,&fr_);
          }
        }
        iVar2 = 1;
      }
      pvVar3 = pvVar3 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return iVar2;
}

Assistant:

int exefuse(voccxdef *ctx, int do_run)
{
    runcxdef *rcx = ctx->voccxrun;
    vocddef  *daemon;
    int       i;
    int       found = FALSE;
    runsdef   val;
    int       err;

    /* first, execute any expired function-based fuses */
    for (i = ctx->voccxfuc, daemon = ctx->voccxfus ; i ; ++daemon, --i)
    {
        if (daemon->vocdfn != MCMONINV && daemon->vocdtim == 0)
        {
            objnum thisf = daemon->vocdfn;
         
            found = TRUE;
            ERRBEGIN(ctx->voccxerr)

            /* save an undo record for this slot before changing */
            vocdusav(ctx, daemon);

            /* remove the fuse prior to running  */
            daemon->vocdfn = MCMONINV;

            if (do_run)
            {
                OSCPYSTRUCT(val, daemon->vocdarg);
                runpush(rcx, val.runstyp, &val);
                runfn(rcx, thisf, 1);
            }
            
            ERRCATCH(ctx->voccxerr, err)
                if (err != ERR_RUNEXIT && err != ERR_RUNEXITOBJ)
                    errrse(ctx->voccxerr);
            ERREND(ctx->voccxerr)
        }
    }

    /* next, execute any expired method-based notifier fuses */
    for (i = ctx->voccxalc, daemon = ctx->voccxalm ; i ; ++daemon, --i)
    {
        if (daemon->vocdfn != MCMONINV && daemon->vocdtim == 0)
        {
            objnum thisa = daemon->vocdfn;

            found = TRUE;
            ERRBEGIN(ctx->voccxerr)

            /* save an undo record for this slot before changing */
            vocdusav(ctx, daemon);

            /* delete it prior to running it */
            daemon->vocdfn = MCMONINV;

            if (do_run)
                runppr(rcx, thisa, daemon->vocdprp, 0);
            
            ERRCATCH(ctx->voccxerr, err)
                if (err != ERR_RUNEXIT && err != ERR_RUNEXITOBJ)
                    errrse(ctx->voccxerr);
            ERREND(ctx->voccxerr)
        }
    }

    /* return true if we found any expired fuses */
    return found;
}